

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vtabCallConstructor(sqlite3 *db,Table *pTab,Module *pMod,
                       _func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr
                       *xConstruct,char **pzErr)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  int local_bc;
  int nDel;
  int j;
  int i;
  int nType;
  char *zType;
  u16 oooHidden;
  int iCol;
  char *zFormat;
  VtabCtx *pCtx;
  int iDb;
  char *zModuleName;
  char *zErr;
  char **ppcStack_70;
  int nArg;
  char **azArg;
  VTable *pVStack_60;
  int rc;
  VTable *pVTable;
  VtabCtx sCtx;
  char **pzErr_local;
  _func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr
  *xConstruct_local;
  Module *pMod_local;
  Table *pTab_local;
  sqlite3 *db_local;
  
  zErr._4_4_ = (pTab->u).tab.addColOffset;
  zModuleName = (char *)0x0;
  ppcStack_70 = (pTab->u).vtab.azArg;
  zFormat = (char *)db->pVtabCtx;
  while( true ) {
    sCtx._24_8_ = pzErr;
    if (zFormat == (char *)0x0) {
      pcVar3 = sqlite3DbStrDup(db,pTab->zName);
      if (pcVar3 == (char *)0x0) {
        db_local._4_4_ = 7;
      }
      else {
        pVStack_60 = (VTable *)sqlite3MallocZero(0x30);
        if (pVStack_60 == (VTable *)0x0) {
          sqlite3OomFault(db);
          sqlite3DbFree(db,pcVar3);
          db_local._4_4_ = 7;
        }
        else {
          pVStack_60->db = db;
          pVStack_60->pMod = pMod;
          pVStack_60->eVtabRisk = '\x01';
          iVar1 = sqlite3SchemaToIndex(db,pTab->pSchema);
          ((pTab->u).tab.pFKey)->pNextFrom = (FKey *)db->aDb[iVar1].zDbSName;
          pVTable = pVStack_60;
          sCtx.pTab = (Table *)db->pVtabCtx;
          sCtx.pPrior._0_4_ = 0;
          db->pVtabCtx = (VtabCtx *)&pVTable;
          sCtx.pVTable = (VTable *)pTab;
          azArg._4_4_ = (*xConstruct)(db,pMod->pAux,zErr._4_4_,ppcStack_70,&pVStack_60->pVtab,
                                      &zModuleName);
          db->pVtabCtx = (VtabCtx *)sCtx.pTab;
          if (azArg._4_4_ == 7) {
            sqlite3OomFault(db);
          }
          if (azArg._4_4_ == 0) {
            if (pVStack_60->pVtab != (sqlite3_vtab *)0x0) {
              memset(pVStack_60->pVtab,0,0x18);
              pVStack_60->pVtab->pModule = pMod->pModule;
              pMod->nRefModule = pMod->nRefModule + 1;
              pVStack_60->nRef = 1;
              if ((int)sCtx.pPrior == 0) {
                pcVar4 = sqlite3MPrintf(db,"vtable constructor did not declare schema: %s",
                                        pTab->zName);
                *(char **)sCtx._24_8_ = pcVar4;
                sqlite3VtabUnlock(pVStack_60);
                azArg._4_4_ = 1;
              }
              else {
                zType._2_2_ = 0;
                pVStack_60->pNext = (VTable *)(pTab->u).tab.pDfltList;
                (pTab->u).vtab.p = pVStack_60;
                for (zType._4_4_ = 0; zType._4_4_ < pTab->nCol; zType._4_4_ = zType._4_4_ + 1) {
                  pcVar4 = sqlite3ColumnType(pTab->aCol + zType._4_4_,"");
                  iVar1 = sqlite3Strlen30(pcVar4);
                  nDel = 0;
                  while ((nDel < iVar1 &&
                         (((iVar2 = sqlite3_strnicmp("hidden",pcVar4 + nDel,6), iVar2 != 0 ||
                           ((nDel != 0 && (pcVar4[nDel + -1] != ' ')))) ||
                          ((pcVar4[nDel + 6] != '\0' && (pcVar4[nDel + 6] != ' '))))))) {
                    nDel = nDel + 1;
                  }
                  if (nDel < iVar1) {
                    iVar2 = (pcVar4[nDel + 6] != '\0') + 6;
                    for (local_bc = nDel; local_bc + iVar2 <= iVar1; local_bc = local_bc + 1) {
                      pcVar4[local_bc] = pcVar4[local_bc + iVar2];
                    }
                    if ((pcVar4[nDel] == '\0') && (0 < nDel)) {
                      pcVar4[nDel + -1] = '\0';
                    }
                    pTab->aCol[zType._4_4_].colFlags = pTab->aCol[zType._4_4_].colFlags | 2;
                    pTab->tabFlags = pTab->tabFlags | 2;
                    zType._2_2_ = 0x400;
                  }
                  else {
                    pTab->tabFlags = (uint)zType._2_2_ | pTab->tabFlags;
                  }
                }
              }
            }
          }
          else {
            if (zModuleName == (char *)0x0) {
              pcVar4 = sqlite3MPrintf(db,"vtable constructor failed: %s",pcVar3);
              *(char **)sCtx._24_8_ = pcVar4;
            }
            else {
              pcVar4 = sqlite3MPrintf(db,"%s",zModuleName);
              *(char **)sCtx._24_8_ = pcVar4;
              sqlite3_free(zModuleName);
            }
            sqlite3DbFree(db,pVStack_60);
          }
          sqlite3DbFree(db,pcVar3);
          db_local._4_4_ = azArg._4_4_;
        }
      }
      return db_local._4_4_;
    }
    if (*(Table **)(zFormat + 8) == pTab) break;
    zFormat = *(char **)(zFormat + 0x10);
  }
  pcVar3 = sqlite3MPrintf(db,"vtable constructor called recursively: %s",pTab->zName);
  *(char **)sCtx._24_8_ = pcVar3;
  return 6;
}

Assistant:

static int vtabCallConstructor(
  sqlite3 *db,
  Table *pTab,
  Module *pMod,
  int (*xConstruct)(sqlite3*,void*,int,const char*const*,sqlite3_vtab**,char**),
  char **pzErr
){
  VtabCtx sCtx;
  VTable *pVTable;
  int rc;
  const char *const*azArg;
  int nArg = pTab->u.vtab.nArg;
  char *zErr = 0;
  char *zModuleName;
  int iDb;
  VtabCtx *pCtx;

  assert( IsVirtual(pTab) );
  azArg = (const char *const*)pTab->u.vtab.azArg;

  /* Check that the virtual-table is not already being initialized */
  for(pCtx=db->pVtabCtx; pCtx; pCtx=pCtx->pPrior){
    if( pCtx->pTab==pTab ){
      *pzErr = sqlite3MPrintf(db,
          "vtable constructor called recursively: %s", pTab->zName
      );
      return SQLITE_LOCKED;
    }
  }

  zModuleName = sqlite3DbStrDup(db, pTab->zName);
  if( !zModuleName ){
    return SQLITE_NOMEM_BKPT;
  }

  pVTable = sqlite3MallocZero(sizeof(VTable));
  if( !pVTable ){
    sqlite3OomFault(db);
    sqlite3DbFree(db, zModuleName);
    return SQLITE_NOMEM_BKPT;
  }
  pVTable->db = db;
  pVTable->pMod = pMod;
  pVTable->eVtabRisk = SQLITE_VTABRISK_Normal;

  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  pTab->u.vtab.azArg[1] = db->aDb[iDb].zDbSName;

  /* Invoke the virtual table constructor */
  assert( &db->pVtabCtx );
  assert( xConstruct );
  sCtx.pTab = pTab;
  sCtx.pVTable = pVTable;
  sCtx.pPrior = db->pVtabCtx;
  sCtx.bDeclared = 0;
  db->pVtabCtx = &sCtx;
  rc = xConstruct(db, pMod->pAux, nArg, azArg, &pVTable->pVtab, &zErr);
  db->pVtabCtx = sCtx.pPrior;
  if( rc==SQLITE_NOMEM ) sqlite3OomFault(db);
  assert( sCtx.pTab==pTab );

  if( SQLITE_OK!=rc ){
    if( zErr==0 ){
      *pzErr = sqlite3MPrintf(db, "vtable constructor failed: %s", zModuleName);
    }else {
      *pzErr = sqlite3MPrintf(db, "%s", zErr);
      sqlite3_free(zErr);
    }
    sqlite3DbFree(db, pVTable);
  }else if( ALWAYS(pVTable->pVtab) ){
    /* Justification of ALWAYS():  A correct vtab constructor must allocate
    ** the sqlite3_vtab object if successful.  */
    memset(pVTable->pVtab, 0, sizeof(pVTable->pVtab[0]));
    pVTable->pVtab->pModule = pMod->pModule;
    pMod->nRefModule++;
    pVTable->nRef = 1;
    if( sCtx.bDeclared==0 ){
      const char *zFormat = "vtable constructor did not declare schema: %s";
      *pzErr = sqlite3MPrintf(db, zFormat, pTab->zName);
      sqlite3VtabUnlock(pVTable);
      rc = SQLITE_ERROR;
    }else{
      int iCol;
      u16 oooHidden = 0;
      /* If everything went according to plan, link the new VTable structure
      ** into the linked list headed by pTab->u.vtab.p. Then loop through the
      ** columns of the table to see if any of them contain the token "hidden".
      ** If so, set the Column COLFLAG_HIDDEN flag and remove the token from
      ** the type string.  */
      pVTable->pNext = pTab->u.vtab.p;
      pTab->u.vtab.p = pVTable;

      for(iCol=0; iCol<pTab->nCol; iCol++){
        char *zType = sqlite3ColumnType(&pTab->aCol[iCol], "");
        int nType;
        int i = 0;
        nType = sqlite3Strlen30(zType);
        for(i=0; i<nType; i++){
          if( 0==sqlite3StrNICmp("hidden", &zType[i], 6)
           && (i==0 || zType[i-1]==' ')
           && (zType[i+6]=='\0' || zType[i+6]==' ')
          ){
            break;
          }
        }
        if( i<nType ){
          int j;
          int nDel = 6 + (zType[i+6] ? 1 : 0);
          for(j=i; (j+nDel)<=nType; j++){
            zType[j] = zType[j+nDel];
          }
          if( zType[i]=='\0' && i>0 ){
            assert(zType[i-1]==' ');
            zType[i-1] = '\0';
          }
          pTab->aCol[iCol].colFlags |= COLFLAG_HIDDEN;
          pTab->tabFlags |= TF_HasHidden;
          oooHidden = TF_OOOHidden;
        }else{
          pTab->tabFlags |= oooHidden;
        }
      }
    }
  }

  sqlite3DbFree(db, zModuleName);
  return rc;
}